

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lru_cache.hpp
# Opt level: O0

void __thiscall
cappuccino::
lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_erase(lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
           *this,size_t element_idx)

{
  bool bVar1;
  lru_iterator *__x;
  __off64_t *in_R8;
  size_t in_R9;
  uint in_stack_ffffffffffffff88;
  _List_const_iterator<unsigned_long> local_40;
  _List_const_iterator<unsigned_long> local_38;
  _List_node_base *local_30;
  _Self local_28;
  reference local_20;
  element *e;
  size_t element_idx_local;
  lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  
  e = (element *)element_idx;
  element_idx_local = (size_t)this;
  local_20 = std::
             vector<cappuccino::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
             ::operator[](&this->m_elements,element_idx);
  __x = &local_20->m_lru_position;
  local_30 = (this->m_lru_end)._M_node;
  local_28._M_node = (_List_node_base *)std::prev<std::_List_iterator<unsigned_long>>(local_30,1);
  bVar1 = std::operator!=(__x,&local_28);
  if (bVar1) {
    std::_List_const_iterator<unsigned_long>::_List_const_iterator(&local_38,&this->m_lru_end);
    std::_List_const_iterator<unsigned_long>::_List_const_iterator
              (&local_40,&local_20->m_lru_position);
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::splice
              (&this->m_lru_list,(int)local_38._M_node,(__off64_t *)&this->m_lru_list,
               (int)local_40._M_node,in_R8,in_R9,in_stack_ffffffffffffff88);
  }
  std::_List_iterator<unsigned_long>::operator--(&this->m_lru_end);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::erase(&this->m_keyed_elements,
          (iterator)
          (local_20->m_keyed_position).
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
          ._M_cur);
  this->m_used_size = this->m_used_size - 1;
  return;
}

Assistant:

auto do_erase(size_t element_idx) -> void
    {
        element& e = m_elements[element_idx];

        if (e.m_lru_position != std::prev(m_lru_end))
        {
            m_lru_list.splice(m_lru_end, m_lru_list, e.m_lru_position);
        }
        --m_lru_end;

        m_keyed_elements.erase(e.m_keyed_position);

        --m_used_size;
    }